

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,REF_CELL ref_cell,FILE *file)

{
  char cVar1;
  REF_MPI pRVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  undefined8 uVar6;
  ulong uVar7;
  int celldim;
  int aux;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  double solutiontime;
  char zonename [256];
  int ascii [256];
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  REF_GLOB *local_548;
  long local_540;
  long local_538;
  char local_530;
  char cStack_52f;
  char cStack_52e;
  char cStack_52d;
  char cStack_52c;
  char cStack_52b;
  char cStack_52a;
  char acStack_529 [253];
  int aiStack_42c [257];
  
  pRVar2 = ref_grid->mpi;
  local_54c = 0x43958000;
  local_550 = 0xffffffff;
  local_554 = 0xffffffff;
  local_530 = '\0';
  cStack_52f = '\0';
  cStack_52e = '\0';
  cStack_52d = '\0';
  cStack_52c = '\0';
  cStack_52b = '\0';
  cStack_52a = '\0';
  acStack_529[0] = '\0';
  local_558 = 0xffffffff;
  local_560 = 0;
  local_564 = 0;
  local_568 = 0;
  local_578 = 0;
  local_574 = 0;
  local_55c = 5;
  uVar3 = ref_grid_compact_cell_nodes(ref_grid,ref_cell,&local_540,&local_538,&local_548);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xeff,
           "ref_gather_plt_brick_header",(ulong)uVar3,"l2c");
    return uVar3;
  }
  if (local_538 < 1 || local_540 < 1) {
LAB_0013f039:
    uVar3 = 0;
    if (local_548 != (REF_GLOB *)0x0) {
      free(local_548);
    }
  }
  else {
    if (local_540 < 0x80000000) {
      local_56c = (undefined4)local_540;
      if (local_538 < 0x80000000) {
        local_570 = (undefined4)local_538;
        if (pRVar2->id == 0) {
          sVar4 = fwrite(&local_54c,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf0b,"ref_gather_plt_brick_header","zonemarker",1,sVar4);
            return 1;
          }
          uVar6 = 0;
          snprintf((char *)((long)acStack_529 + 1),0x100,"brick%d",(ulong)(uint)ref_cell->node_per);
          uVar7 = 1;
          do {
            cVar1 = acStack_529[uVar7];
            aiStack_42c[uVar7] = (int)cVar1;
            if (cVar1 == '\0') goto LAB_0013f123;
            uVar7 = uVar7 + 1;
          } while (uVar7 != 0x101);
          uVar6 = 7;
          uVar7 = 0x100;
LAB_0013f123:
          if (cVar1 != '\0') {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf0e,"ref_gather_plt_brick_header",uVar6,"a2i");
            return (uint)uVar6;
          }
          uVar7 = uVar7 & 0xffffffff;
          sVar4 = fwrite(aiStack_42c + 1,4,uVar7,(FILE *)file);
          if (sVar4 != uVar7) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf0f,"ref_gather_plt_brick_header","title",uVar7,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_550,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf11,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_554,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf12,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&stack0xfffffffffffffad0,8,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf13,"ref_gather_plt_brick_header","double",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_558,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf14,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_55c,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf15,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_560,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf16,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_564,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf17,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_568,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf18,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_56c,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf19,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_570,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf1a,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_578,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf1b,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_578,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf1c,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_578,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf1d,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
          sVar4 = fwrite(&local_574,4,1,(FILE *)file);
          if (sVar4 != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xf1e,"ref_gather_plt_brick_header","int",1,sVar4);
            return 1;
          }
        }
        goto LAB_0013f039;
      }
      pcVar5 = "too many bricks for int";
      uVar6 = 0xf07;
    }
    else {
      pcVar5 = "too many nodes for int";
      uVar6 = 0xf05;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar6,
           "ref_gather_plt_brick_header",pcVar5);
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,
                                                      REF_CELL ref_cell,
                                                      FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  char zonename[256];
  int ascii[256];
  int len;
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 5; /*5=FEBRICK*/

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many bricks for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    snprintf(zonename, 256, "brick%d", ref_cell_node_per(ref_cell));
    RSS(ref_gather_plt_char_int(zonename, 256, &len, ascii), "a2i");
    REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}